

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_helper.cc
# Opt level: O3

int bio_ip_and_port_to_socket_and_addr
              (int *out_sock,sockaddr_storage *out_addr,socklen_t *out_addr_length,char *hostname,
              char *port_str)

{
  int iVar1;
  socklen_t sVar2;
  char *pcVar3;
  int iVar4;
  addrinfo *paVar5;
  addrinfo *result;
  addrinfo *local_60;
  addrinfo local_58;
  
  *out_sock = -1;
  local_58.ai_flags = 0;
  local_58.ai_family = 0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_socktype = 1;
  local_58.ai_protocol = 0;
  iVar1 = getaddrinfo(hostname,port_str,&local_58,&local_60);
  if (iVar1 == 0) {
    iVar4 = 0;
    for (paVar5 = local_60; paVar5 != (addrinfo *)0x0; paVar5 = paVar5->ai_next) {
      if (paVar5->ai_addrlen < 0x81) {
        out_addr->__ss_padding[0x6e] = '\0';
        out_addr->__ss_padding[0x6f] = '\0';
        out_addr->__ss_padding[0x70] = '\0';
        out_addr->__ss_padding[0x71] = '\0';
        out_addr->__ss_padding[0x72] = '\0';
        out_addr->__ss_padding[0x73] = '\0';
        out_addr->__ss_padding[0x74] = '\0';
        out_addr->__ss_padding[0x75] = '\0';
        out_addr->__ss_align = 0;
        out_addr->__ss_padding[0x5e] = '\0';
        out_addr->__ss_padding[0x5f] = '\0';
        out_addr->__ss_padding[0x60] = '\0';
        out_addr->__ss_padding[0x61] = '\0';
        out_addr->__ss_padding[0x62] = '\0';
        out_addr->__ss_padding[99] = '\0';
        out_addr->__ss_padding[100] = '\0';
        out_addr->__ss_padding[0x65] = '\0';
        out_addr->__ss_padding[0x66] = '\0';
        out_addr->__ss_padding[0x67] = '\0';
        out_addr->__ss_padding[0x68] = '\0';
        out_addr->__ss_padding[0x69] = '\0';
        out_addr->__ss_padding[0x6a] = '\0';
        out_addr->__ss_padding[0x6b] = '\0';
        out_addr->__ss_padding[0x6c] = '\0';
        out_addr->__ss_padding[0x6d] = '\0';
        out_addr->__ss_padding[0x4e] = '\0';
        out_addr->__ss_padding[0x4f] = '\0';
        out_addr->__ss_padding[0x50] = '\0';
        out_addr->__ss_padding[0x51] = '\0';
        out_addr->__ss_padding[0x52] = '\0';
        out_addr->__ss_padding[0x53] = '\0';
        out_addr->__ss_padding[0x54] = '\0';
        out_addr->__ss_padding[0x55] = '\0';
        out_addr->__ss_padding[0x56] = '\0';
        out_addr->__ss_padding[0x57] = '\0';
        out_addr->__ss_padding[0x58] = '\0';
        out_addr->__ss_padding[0x59] = '\0';
        out_addr->__ss_padding[0x5a] = '\0';
        out_addr->__ss_padding[0x5b] = '\0';
        out_addr->__ss_padding[0x5c] = '\0';
        out_addr->__ss_padding[0x5d] = '\0';
        out_addr->__ss_padding[0x3e] = '\0';
        out_addr->__ss_padding[0x3f] = '\0';
        out_addr->__ss_padding[0x40] = '\0';
        out_addr->__ss_padding[0x41] = '\0';
        out_addr->__ss_padding[0x42] = '\0';
        out_addr->__ss_padding[0x43] = '\0';
        out_addr->__ss_padding[0x44] = '\0';
        out_addr->__ss_padding[0x45] = '\0';
        out_addr->__ss_padding[0x46] = '\0';
        out_addr->__ss_padding[0x47] = '\0';
        out_addr->__ss_padding[0x48] = '\0';
        out_addr->__ss_padding[0x49] = '\0';
        out_addr->__ss_padding[0x4a] = '\0';
        out_addr->__ss_padding[0x4b] = '\0';
        out_addr->__ss_padding[0x4c] = '\0';
        out_addr->__ss_padding[0x4d] = '\0';
        out_addr->__ss_padding[0x2e] = '\0';
        out_addr->__ss_padding[0x2f] = '\0';
        out_addr->__ss_padding[0x30] = '\0';
        out_addr->__ss_padding[0x31] = '\0';
        out_addr->__ss_padding[0x32] = '\0';
        out_addr->__ss_padding[0x33] = '\0';
        out_addr->__ss_padding[0x34] = '\0';
        out_addr->__ss_padding[0x35] = '\0';
        out_addr->__ss_padding[0x36] = '\0';
        out_addr->__ss_padding[0x37] = '\0';
        out_addr->__ss_padding[0x38] = '\0';
        out_addr->__ss_padding[0x39] = '\0';
        out_addr->__ss_padding[0x3a] = '\0';
        out_addr->__ss_padding[0x3b] = '\0';
        out_addr->__ss_padding[0x3c] = '\0';
        out_addr->__ss_padding[0x3d] = '\0';
        out_addr->__ss_padding[0x1e] = '\0';
        out_addr->__ss_padding[0x1f] = '\0';
        out_addr->__ss_padding[0x20] = '\0';
        out_addr->__ss_padding[0x21] = '\0';
        out_addr->__ss_padding[0x22] = '\0';
        out_addr->__ss_padding[0x23] = '\0';
        out_addr->__ss_padding[0x24] = '\0';
        out_addr->__ss_padding[0x25] = '\0';
        out_addr->__ss_padding[0x26] = '\0';
        out_addr->__ss_padding[0x27] = '\0';
        out_addr->__ss_padding[0x28] = '\0';
        out_addr->__ss_padding[0x29] = '\0';
        out_addr->__ss_padding[0x2a] = '\0';
        out_addr->__ss_padding[0x2b] = '\0';
        out_addr->__ss_padding[0x2c] = '\0';
        out_addr->__ss_padding[0x2d] = '\0';
        out_addr->__ss_padding[0xe] = '\0';
        out_addr->__ss_padding[0xf] = '\0';
        out_addr->__ss_padding[0x10] = '\0';
        out_addr->__ss_padding[0x11] = '\0';
        out_addr->__ss_padding[0x12] = '\0';
        out_addr->__ss_padding[0x13] = '\0';
        out_addr->__ss_padding[0x14] = '\0';
        out_addr->__ss_padding[0x15] = '\0';
        out_addr->__ss_padding[0x16] = '\0';
        out_addr->__ss_padding[0x17] = '\0';
        out_addr->__ss_padding[0x18] = '\0';
        out_addr->__ss_padding[0x19] = '\0';
        out_addr->__ss_padding[0x1a] = '\0';
        out_addr->__ss_padding[0x1b] = '\0';
        out_addr->__ss_padding[0x1c] = '\0';
        out_addr->__ss_padding[0x1d] = '\0';
        out_addr->ss_family = 0;
        out_addr->__ss_padding[0] = '\0';
        out_addr->__ss_padding[1] = '\0';
        out_addr->__ss_padding[2] = '\0';
        out_addr->__ss_padding[3] = '\0';
        out_addr->__ss_padding[4] = '\0';
        out_addr->__ss_padding[5] = '\0';
        out_addr->__ss_padding[6] = '\0';
        out_addr->__ss_padding[7] = '\0';
        out_addr->__ss_padding[8] = '\0';
        out_addr->__ss_padding[9] = '\0';
        out_addr->__ss_padding[10] = '\0';
        out_addr->__ss_padding[0xb] = '\0';
        out_addr->__ss_padding[0xc] = '\0';
        out_addr->__ss_padding[0xd] = '\0';
        if ((ulong)paVar5->ai_addrlen == 0) {
          sVar2 = 0;
        }
        else {
          memcpy(out_addr,paVar5->ai_addr,(ulong)paVar5->ai_addrlen);
          sVar2 = paVar5->ai_addrlen;
        }
        *out_addr_length = sVar2;
        iVar1 = socket(paVar5->ai_family,paVar5->ai_socktype,paVar5->ai_protocol);
        *out_sock = iVar1;
        iVar4 = 1;
        if (iVar1 < 0) {
          iVar4 = 0;
          ERR_put_error(2,0,0,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/socket_helper.cc"
                        ,0x4e);
        }
        break;
      }
    }
    freeaddrinfo(local_60);
  }
  else {
    iVar4 = 0;
    ERR_put_error(2,0,0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/socket_helper.cc"
                  ,0x39);
    pcVar3 = gai_strerror(iVar1);
    ERR_add_error_data(1,pcVar3);
  }
  return iVar4;
}

Assistant:

int bio_ip_and_port_to_socket_and_addr(int *out_sock,
                                       struct sockaddr_storage *out_addr,
                                       socklen_t *out_addr_length,
                                       const char *hostname,
                                       const char *port_str) {
  struct addrinfo hint, *result, *cur;
  int ret;

  *out_sock = -1;

  OPENSSL_memset(&hint, 0, sizeof(hint));
  hint.ai_family = AF_UNSPEC;
  hint.ai_socktype = SOCK_STREAM;

  ret = getaddrinfo(hostname, port_str, &hint, &result);
  if (ret != 0) {
    OPENSSL_PUT_ERROR(SYS, 0);
#if defined(OPENSSL_WINDOWS)
    ERR_add_error_data(1, gai_strerrorA(ret));
#else
    ERR_add_error_data(1, gai_strerror(ret));
#endif
    return 0;
  }

  ret = 0;

  for (cur = result; cur; cur = cur->ai_next) {
    if ((size_t) cur->ai_addrlen > sizeof(struct sockaddr_storage)) {
      continue;
    }
    OPENSSL_memset(out_addr, 0, sizeof(struct sockaddr_storage));
    OPENSSL_memcpy(out_addr, cur->ai_addr, cur->ai_addrlen);
    *out_addr_length = cur->ai_addrlen;

    *out_sock = socket(cur->ai_family, cur->ai_socktype, cur->ai_protocol);
    if (*out_sock < 0) {
      OPENSSL_PUT_SYSTEM_ERROR();
      goto out;
    }

    ret = 1;
    break;
  }

out:
  freeaddrinfo(result);
  return ret;
}